

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O3

UVector * __thiscall
icu_63::ICUService::getVisibleIDs
          (ICUService *this,UVector *result,UnicodeString *matchID,UErrorCode *status)

{
  UnicodeString *that;
  char cVar1;
  int iVar2;
  undefined8 in_RAX;
  Hashtable *pHVar3;
  undefined4 extraout_var;
  UHashElement *pUVar5;
  UnicodeString *pUVar6;
  int32_t pos;
  undefined1 auStack_38 [8];
  long *plVar4;
  
  auStack_38 = (undefined1  [8])in_RAX;
  UVector::removeAllElements(result);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    umtx_lock_63((UMutex *)lock);
    pHVar3 = getVisibleIDMap(this,status);
    if (pHVar3 != (Hashtable *)0x0) {
      iVar2 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0xd])(this,matchID,status);
      plVar4 = (long *)CONCAT44(extraout_var,iVar2);
      auStack_38._4_4_ = 0xffffffff;
LAB_002b530e:
      do {
        pUVar6 = (UnicodeString *)(auStack_38 + 4);
        pUVar5 = uhash_nextElement_63(pHVar3->hash,(int32_t *)pUVar6);
        if (pUVar5 == (UHashElement *)0x0) goto LAB_002b538e;
        that = (UnicodeString *)(pUVar5->key).pointer;
        if (plVar4 != (long *)0x0) {
          pUVar6 = that;
          cVar1 = (**(code **)(*plVar4 + 0x40))(plVar4);
          if (cVar1 == '\0') goto LAB_002b530e;
        }
        pUVar6 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)pUVar6);
        if (pUVar6 == (UnicodeString *)0x0) {
LAB_002b5387:
          *status = U_MEMORY_ALLOCATION_ERROR;
          goto LAB_002b538e;
        }
        UnicodeString::UnicodeString(pUVar6,that);
        if ((undefined1  [56])((undefined1  [56])pUVar6->fUnion & (undefined1  [56])0x1) !=
            (undefined1  [56])0x0) {
          (*(pUVar6->super_Replaceable).super_UObject._vptr_UObject[1])(pUVar6);
          goto LAB_002b5387;
        }
        UVector::addElement(result,pUVar6,status);
      } while (*status < U_ILLEGAL_ARGUMENT_ERROR);
      (*(pUVar6->super_Replaceable).super_UObject._vptr_UObject[1])(pUVar6);
LAB_002b538e:
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 8))(plVar4);
      }
    }
    umtx_unlock_63((UMutex *)lock);
    if (U_ZERO_ERROR < *status) {
      UVector::removeAllElements(result);
    }
  }
  return result;
}

Assistant:

UVector& 
ICUService::getVisibleIDs(UVector& result, const UnicodeString* matchID, UErrorCode& status) const 
{
    result.removeAllElements();

    if (U_FAILURE(status)) {
        return result;
    }

    {
        Mutex mutex(&lock);
        const Hashtable* map = getVisibleIDMap(status);
        if (map != NULL) {
            ICUServiceKey* fallbackKey = createKey(matchID, status);

            for (int32_t pos = UHASH_FIRST;;) {
                const UHashElement* e = map->nextElement(pos);
                if (e == NULL) {
                    break;
                }

                const UnicodeString* id = (const UnicodeString*)e->key.pointer;
                if (fallbackKey != NULL) {
                    if (!fallbackKey->isFallbackOf(*id)) {
                        continue;
                    }
                }

                UnicodeString* idClone = new UnicodeString(*id);
                if (idClone == NULL || idClone->isBogus()) {
                    delete idClone;
                    status = U_MEMORY_ALLOCATION_ERROR;
                    break;
                }
                result.addElement(idClone, status);
                if (U_FAILURE(status)) {
                    delete idClone;
                    break;
                }
            }
            delete fallbackKey;
        }
    }
    if (U_FAILURE(status)) {
        result.removeAllElements();
    }
    return result;
}